

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O1

void __thiscall glu::Shader::Shader(Shader *this,RenderContext *renderCtx,ShaderType shaderType)

{
  int iVar1;
  GLuint GVar2;
  GLenum err;
  undefined4 extraout_var;
  TestError *this_00;
  
  iVar1 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  this->m_gl = (Functions *)CONCAT44(extraout_var,iVar1);
  this->m_shader = 0;
  (this->m_info).source._M_dataplus._M_p = (pointer)&(this->m_info).source.field_2;
  (this->m_info).source._M_string_length = 0;
  (this->m_info).source.field_2._M_local_buf[0] = '\0';
  (this->m_info).infoLog._M_dataplus._M_p = (pointer)&(this->m_info).infoLog.field_2;
  (this->m_info).infoLog._M_string_length = 0;
  (this->m_info).infoLog.field_2._M_local_buf[0] = '\0';
  (this->m_info).compileOk = false;
  (this->m_info).compileTimeUs = 0;
  (this->m_info).type = shaderType;
  GVar2 = (*((Functions *)CONCAT44(extraout_var,iVar1))->createShader)
                    (getGLShaderType::s_typeMap[shaderType]);
  this->m_shader = GVar2;
  err = (*this->m_gl->getError)();
  checkError(err,"glCreateShader()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0x2e);
  if (this->m_shader != 0) {
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"m_shader",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0x2f);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

Shader::Shader (const RenderContext& renderCtx, ShaderType shaderType)
	: m_gl		(renderCtx.getFunctions())
	, m_shader	(0)
{
	m_info.type	= shaderType;
	m_shader	= m_gl.createShader(getGLShaderType(shaderType));
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCreateShader()");
	TCU_CHECK(m_shader);
}